

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O3

void Str_ManNormalize_rec
               (Str_Ntk_t *pNtk,Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Wec_t *vGroups,Vec_Int_t *vRoots)

{
  Gia_Obj_t *pGVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  Str_Obj_t *pSVar4;
  Str_Ntk_t *pNtk_00;
  int t;
  uint uVar5;
  Vec_Int_t *pVVar6;
  int *piVar7;
  uint uVar8;
  uint *puVar9;
  char *__function;
  Gia_Obj_t *pGVar10;
  int i;
  long lVar11;
  ulong uVar12;
  Vec_Int_t *pVVar13;
  Vec_Int_t *pVVar14;
  char *__file;
  char *__assertion;
  uint uVar15;
  int iVar16;
  ulong uVar17;
  long lVar18;
  int pFanins [3];
  uint local_64 [3];
  Vec_Int_t *local_58;
  Vec_Int_t *local_50;
  Str_Ntk_t *local_48;
  Gia_Obj_t *local_40;
  uint local_34;
  
  if (pObj->Value != 0xffffffff) {
    return;
  }
  pObj->Value = 0;
  local_58 = vRoots;
  if (((int)(uint)*(undefined8 *)pObj < 0) ||
     (uVar5 = (uint)*(undefined8 *)pObj & 0x1fffffff, uVar5 == 0x1fffffff)) {
    __assert_fail("Gia_ObjIsAnd(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStr.c"
                  ,0x285,
                  "void Str_ManNormalize_rec(Str_Ntk_t *, Gia_Man_t *, Gia_Obj_t *, Vec_Wec_t *, Vec_Int_t *)"
                 );
  }
  pGVar10 = p->pObjs;
  if ((pObj < pGVar10) || (pGVar10 + p->nObjs <= pObj)) {
LAB_007e43fb:
    __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                  ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
  }
  puVar9 = p->pMuxes;
  local_48 = pNtk;
  if ((puVar9 != (uint *)0x0) &&
     (uVar8 = (int)((long)pObj - (long)pGVar10 >> 2) * -0x55555555, puVar9[(int)uVar8] != 0)) {
    if (((int)uVar8 < 0) || (vRoots->nSize <= (int)uVar8)) {
LAB_007e4322:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    uVar8 = vRoots->pArray[uVar8 & 0x7fffffff];
    uVar12 = (ulong)uVar8;
    if (uVar12 != 0xffffffff) {
      if (((int)uVar8 < 0) || (vGroups->nSize <= (int)uVar8)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                      ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      pVVar6 = vGroups->pArray + uVar12;
      uVar5 = vGroups->pArray[uVar12].nSize;
      uVar12 = (ulong)uVar5;
      local_40 = pObj;
      if (0 < (int)uVar5) {
        lVar18 = 0;
        local_50 = pVVar6;
        do {
          iVar16 = local_50->pArray[lVar18];
          if (((long)iVar16 < 0) || (p->nObjs <= iVar16)) goto LAB_007e4303;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          Str_MuxInputsCollect(p,p->pObjs + iVar16,p->vSuper);
          pVVar6 = p->vSuper;
          pVVar13 = p->vStore;
          uVar5 = pVVar13->nSize;
          uVar12 = (ulong)uVar5;
          if (0 < pVVar6->nSize) {
            lVar11 = 0;
            do {
              Vec_IntPush(pVVar13,pVVar6->pArray[lVar11]);
              pNtk = local_48;
              lVar11 = lVar11 + 1;
            } while (lVar11 < pVVar6->nSize);
            pVVar13 = p->vStore;
            iVar16 = pVVar13->nSize;
            if ((int)uVar5 < iVar16) {
              do {
                if (((int)uVar5 < 0) || (p->vStore->nSize <= (int)uVar12)) goto LAB_007e4322;
                iVar2 = p->vStore->pArray[uVar12];
                if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) goto LAB_007e4303;
                Str_ManNormalize_rec(pNtk,p,p->pObjs + iVar2,vGroups,local_58);
                uVar12 = uVar12 + 1;
              } while ((int)uVar12 < iVar16);
              pVVar13 = p->vStore;
              iVar16 = pVVar13->nSize;
            }
            if (iVar16 < (int)uVar5) goto LAB_007e441a;
          }
          pVVar13->nSize = uVar5;
          lVar18 = lVar18 + 1;
          uVar12 = (ulong)local_50->nSize;
        } while (lVar18 < (long)uVar12);
        uVar5 = (uint)uVar12;
        pVVar6 = local_50;
        if (0 < (int)uVar5) {
          pVVar13 = &pNtk->vFanins;
          pVVar14 = (Vec_Int_t *)0x0;
          do {
            uVar5 = (uint)uVar12;
            iVar16 = local_50->pArray[(long)pVVar14];
            if (((long)iVar16 < 0) || (p->nObjs <= iVar16)) goto LAB_007e4303;
            pVVar6 = local_50;
            if (p->pObjs == (Gia_Obj_t *)0x0) break;
            pGVar10 = p->pObjs + iVar16;
            local_58 = pVVar14;
            Str_MuxStructCollect(p,pGVar10,p->vSuper);
            pVVar6 = p->vSuper;
            uVar5 = pVVar6->nSize;
            uVar12 = (ulong)uVar5;
            if (0 < (int)uVar5) {
              lVar18 = 0;
              do {
                uVar5 = (uint)uVar12;
                lVar11 = (long)pVVar6->pArray[lVar18];
                if ((lVar11 < 0) || (p->nObjs <= pVVar6->pArray[lVar18])) goto LAB_007e4303;
                pGVar3 = p->pObjs;
                if (pGVar3 == (Gia_Obj_t *)0x0) break;
                pGVar1 = pGVar3 + lVar11;
                uVar12 = *(ulong *)pGVar1;
                if ((int)pGVar1[-(ulong)((uint)uVar12 & 0x1fffffff)].Value < 0) goto LAB_007e4360;
                uVar5 = (uint)(uVar12 >> 0x1d) & 1 ^
                        pGVar1[-(ulong)((uint)uVar12 & 0x1fffffff)].Value;
                local_64[0] = uVar5;
                uVar8 = (uint)(uVar12 >> 0x20);
                if ((int)pGVar1[-(ulong)(uVar8 & 0x1fffffff)].Value < 0) goto LAB_007e4360;
                local_64[1] = pGVar1[-(ulong)(uVar8 & 0x1fffffff)].Value ^ uVar8 >> 0x1d & 1;
                if (p->pMuxes == (uint *)0x0) {
                  uVar8 = 0;
                  puVar9 = (uint *)&DAT_00000008;
                }
                else {
                  uVar8 = p->pMuxes[lVar11];
                  if ((int)uVar8 < 0) goto LAB_007e4341;
                  if ((uint)p->nObjs <= uVar8 >> 1) goto LAB_007e4303;
                  puVar9 = &pGVar3[uVar8 >> 1].Value;
                  uVar8 = uVar8 & 1;
                }
                uVar15 = *puVar9;
                if ((int)uVar15 < 0) goto LAB_007e4360;
                local_64[2] = uVar8 ^ uVar15;
                if (((uVar8 ^ uVar15) & 1) != 0) {
                  local_64[2] = uVar15 & 0x7ffffffe;
                  local_64[0] = local_64[1];
                  local_64[1] = uVar5;
                }
                iVar16 = pNtk->nObjs;
                if (pNtk->nObjsAlloc <= iVar16) goto LAB_007e439e;
                pSVar4 = pNtk->pObjs;
                *(undefined4 *)(pSVar4 + iVar16) = 0x35;
                pSVar4[iVar16].iOffset = (pNtk->vFanins).nSize;
                pSVar4[iVar16].iTop = -1;
                pSVar4[iVar16].iCopy = -1;
                lVar11 = 0;
                do {
                  uVar5 = local_64[lVar11];
                  Vec_IntPush(pVVar13,uVar5);
                  if ((int)uVar5 < 0) goto LAB_007e42e4;
                  lVar11 = lVar11 + 1;
                } while (lVar11 != 3);
                local_48->nObjCount[5] = local_48->nObjCount[5] + 1;
                iVar16 = local_48->nObjs;
                local_48->nObjs = iVar16 + 1;
                if (iVar16 < 0) goto LAB_007e43bd;
                pGVar1->Value = iVar16 * 2;
                lVar18 = lVar18 + 1;
                pVVar6 = p->vSuper;
                uVar5 = pVVar6->nSize;
                uVar12 = (ulong)(int)uVar5;
                pNtk = local_48;
              } while (lVar18 < (long)uVar12);
            }
            uVar8 = pGVar10->Value;
            if (uVar8 == 0xffffffff) {
              __assertion = "~pRoot->Value";
              __file = 
              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStr.c"
              ;
              __function = 
              "void Str_ManNormalize_rec(Str_Ntk_t *, Gia_Man_t *, Gia_Obj_t *, Vec_Wec_t *, Vec_Int_t *)"
              ;
              goto LAB_007e4446;
            }
            if (0 < (int)uVar5) {
              piVar7 = pVVar6->pArray;
              uVar12 = 0;
              do {
                iVar16 = piVar7[uVar12];
                if (((long)iVar16 < 0) || (p->nObjs <= iVar16)) goto LAB_007e4303;
                if (p->pObjs == (Gia_Obj_t *)0x0) break;
                if (((int)uVar8 < 0) || (uVar15 = p->pObjs[iVar16].Value, (int)uVar15 < 0))
                goto LAB_007e4341;
                uVar15 = uVar15 >> 1;
                if (pNtk->nObjs <= (int)uVar15) goto LAB_007e437f;
                pNtk->pObjs[uVar15].iTop = uVar8 >> 1;
                uVar12 = uVar12 + 1;
              } while (uVar5 != uVar12);
            }
            pNtk->nTrees = pNtk->nTrees + 1;
            pVVar14 = (Vec_Int_t *)((long)&local_58->nCap + 1);
            uVar5 = local_50->nSize;
            uVar12 = (ulong)(int)uVar5;
            pVVar6 = local_50;
          } while ((long)pVVar14 < (long)uVar12);
        }
      }
      if (local_40->Value == 0xffffffff) {
        __assert_fail("~pObj->Value",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStr.c"
                      ,0x2bd,
                      "void Str_ManNormalize_rec(Str_Ntk_t *, Gia_Man_t *, Gia_Obj_t *, Vec_Wec_t *, Vec_Int_t *)"
                     );
      }
      if ((int)uVar5 < 1) {
        __assert_fail("p->nSize > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x203,"int Vec_IntEntryLast(Vec_Int_t *)");
      }
      piVar7 = pVVar6->pArray;
      iVar16 = piVar7[(ulong)uVar5 - 1];
      if ((-1 < (long)iVar16) && (uVar8 = p->nObjs, iVar16 < (int)uVar8)) {
        pGVar10 = p->pObjs;
        uVar12 = 0;
        do {
          uVar15 = piVar7[uVar12];
          if (((long)(int)uVar15 < 0) || (uVar8 <= uVar15)) goto LAB_007e4303;
          if (pGVar10 == (Gia_Obj_t *)0x0) break;
          if (((int)pGVar10[iVar16].Value < 0) || ((int)pGVar10[(int)uVar15].Value < 0))
          goto LAB_007e4341;
          uVar15 = pGVar10[(int)uVar15].Value >> 1;
          if (pNtk->nObjs <= (int)uVar15) {
LAB_007e437f:
            __assert_fail("i < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStr.c"
                          ,0x52,"Str_Obj_t *Str_NtkObj(Str_Ntk_t *, int)");
          }
          pNtk->pObjs[uVar15].iTop = pGVar10[iVar16].Value >> 1;
          uVar12 = uVar12 + 1;
        } while (uVar5 != uVar12);
        pNtk->nGroups = pNtk->nGroups + 1;
        return;
      }
LAB_007e4303:
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                    ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    Str_ManNormalize_rec(pNtk,p,pObj + -(ulong)uVar5,vGroups,vRoots);
    Str_ManNormalize_rec
              (pNtk,p,pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff),vGroups,vRoots);
    if (p->pMuxes == (uint *)0x0) {
      pGVar10 = (Gia_Obj_t *)0x0;
    }
    else {
      pGVar10 = p->pObjs;
      if ((pObj < pGVar10) || (pGVar10 + p->nObjs <= pObj)) goto LAB_007e43fb;
      uVar5 = p->pMuxes[(int)((ulong)((long)pObj - (long)pGVar10) >> 2) * -0x55555555];
      if ((int)uVar5 < 0) goto LAB_007e4341;
      uVar5 = uVar5 >> 1;
      if (p->nObjs <= (int)uVar5) goto LAB_007e4303;
      pGVar10 = pGVar10 + uVar5;
    }
    Str_ManNormalize_rec(pNtk,p,pGVar10,vGroups,vRoots);
    uVar12 = *(ulong *)pObj;
    if (-1 < (int)pObj[-(ulong)((uint)uVar12 & 0x1fffffff)].Value) {
      uVar5 = (uint)(uVar12 >> 0x1d) & 1 ^ pObj[-(ulong)((uint)uVar12 & 0x1fffffff)].Value;
      local_64[0] = uVar5;
      uVar8 = (uint)(uVar12 >> 0x20);
      if (-1 < (int)pObj[-(ulong)(uVar8 & 0x1fffffff)].Value) {
        local_64[1] = pObj[-(ulong)(uVar8 & 0x1fffffff)].Value ^ uVar8 >> 0x1d & 1;
        if (p->pMuxes == (uint *)0x0) {
          uVar8 = 0;
          puVar9 = (uint *)&DAT_00000008;
        }
        else {
          pGVar10 = p->pObjs;
          if ((pObj < pGVar10) || (pGVar10 + p->nObjs <= pObj)) goto LAB_007e43fb;
          uVar8 = p->pMuxes[(int)((ulong)((long)pObj - (long)pGVar10) >> 2) * -0x55555555];
          if ((int)uVar8 < 0) {
LAB_007e4341:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                          ,0x12f,"int Abc_Lit2Var(int)");
          }
          if (p->nObjs <= (int)(uVar8 >> 1)) goto LAB_007e4303;
          puVar9 = &pGVar10[uVar8 >> 1].Value;
          uVar8 = uVar8 & 1;
        }
        uVar15 = *puVar9;
        if (-1 < (int)uVar15) {
          local_64[2] = uVar8 ^ uVar15;
          if (((uVar8 ^ uVar15) & 1) != 0) {
            local_64[2] = uVar15 & 0x7ffffffe;
            local_64[0] = local_64[1];
            local_64[1] = uVar5;
          }
          iVar16 = pNtk->nObjs;
          if (pNtk->nObjsAlloc <= iVar16) goto LAB_007e439e;
          pSVar4 = pNtk->pObjs;
          *(undefined4 *)(pSVar4 + iVar16) = 0x35;
          pSVar4[iVar16].iOffset = (pNtk->vFanins).nSize;
          pSVar4[iVar16].iTop = -1;
          pSVar4[iVar16].iCopy = -1;
          lVar18 = 0;
          do {
            uVar5 = local_64[lVar18];
            Vec_IntPush(&pNtk->vFanins,uVar5);
            if ((int)uVar5 < 0) goto LAB_007e42e4;
            lVar18 = lVar18 + 1;
          } while (lVar18 != 3);
          pNtk->nObjCount[5] = pNtk->nObjCount[5] + 1;
          iVar16 = pNtk->nObjs;
          pNtk->nObjs = iVar16 + 1;
          if (-1 < iVar16) {
            pObj->Value = iVar16 * 2;
            return;
          }
          goto LAB_007e43bd;
        }
      }
    }
LAB_007e4360:
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                  ,0x132,"int Abc_LitNotCond(int, int)");
  }
  if (p->vSuper == (Vec_Int_t *)0x0) {
    pVVar6 = (Vec_Int_t *)malloc(0x10);
    pVVar6->nCap = 100;
    pVVar6->nSize = 0;
    piVar7 = (int *)malloc(400);
    pVVar6->pArray = piVar7;
    p->vSuper = pVVar6;
  }
  else {
    p->vSuper->nSize = 0;
  }
  uVar12 = *(ulong *)pObj;
  uVar5 = (uint)uVar12;
  if (((int)uVar5 < 0) || (uVar8 = uVar5 & 0x1fffffff, uVar8 == 0x1fffffff)) {
LAB_007e4450:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStr.c"
                  ,0x270,"void Gia_ManSuperCollect(Gia_Man_t *, Gia_Obj_t *)");
  }
  uVar15 = (uint)(uVar12 >> 0x20) & 0x1fffffff;
  if ((uVar5 & 0x1fffffff) < uVar15) {
    if ((uVar12 & 0x2000000020000000) != 0) {
      __assert_fail("!Gia_ObjFaninC0(pObj) && !Gia_ObjFaninC1(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStr.c"
                    ,0x263,"void Gia_ManSuperCollect(Gia_Man_t *, Gia_Obj_t *)");
    }
    Gia_ManSuperCollectXor_rec(p,pObj + -(ulong)uVar8);
    Gia_ManSuperCollectXor_rec(p,pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff));
    qsort(p->vSuper->pArray,(long)p->vSuper->nSize,4,Vec_IntSortCompare1);
    Gia_ManSimplifyXor(p->vSuper);
  }
  else {
    if (((uVar5 & 0x1fffffff) <= uVar15) ||
       ((puVar9 != (uint *)0x0 &&
        (puVar9[(int)((ulong)((long)pObj - (long)pGVar10) >> 2) * -0x55555555] != 0))))
    goto LAB_007e4450;
    Gia_ManSuperCollectAnd_rec
              (p,(Gia_Obj_t *)((ulong)(uVar5 >> 0x1d & 1) ^ (ulong)(pObj + -(ulong)uVar8)));
    uVar5 = (uint)((ulong)*(undefined8 *)pObj >> 0x20);
    Gia_ManSuperCollectAnd_rec
              (p,(Gia_Obj_t *)
                 ((ulong)(uVar5 >> 0x1d & 1) ^ (ulong)(pObj + -(ulong)(uVar5 & 0x1fffffff))));
    qsort(p->vSuper->pArray,(long)p->vSuper->nSize,4,Vec_IntSortCompare1);
    Gia_ManSimplifyAnd(p->vSuper);
  }
  pVVar6 = p->vSuper;
  if (pVVar6->nSize < 1) {
    __assert_fail("Vec_IntSize(p->vSuper) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStr.c"
                  ,0x271,"void Gia_ManSuperCollect(Gia_Man_t *, Gia_Obj_t *)");
  }
  pVVar13 = p->vStore;
  uVar5 = pVVar13->nSize;
  pVVar14 = (Vec_Int_t *)(ulong)uVar5;
  lVar18 = 0;
  do {
    Vec_IntPush(pVVar13,pVVar6->pArray[lVar18]);
    pNtk_00 = local_48;
    lVar18 = lVar18 + 1;
  } while (lVar18 < pVVar6->nSize);
  pVVar6 = p->vStore;
  iVar16 = pVVar6->nSize;
  local_50 = (Vec_Int_t *)CONCAT44(local_50._4_4_,iVar16);
  local_34 = iVar16 - uVar5;
  pVVar13 = pVVar14;
  local_40 = pObj;
  if (local_34 != 0 && (int)uVar5 <= iVar16) {
    do {
      if (((int)uVar5 < 0) || (pVVar6->nSize <= (int)pVVar13)) goto LAB_007e4322;
      uVar8 = pVVar6->pArray[(long)pVVar13];
      if ((int)uVar8 < 0) goto LAB_007e4341;
      if (p->nObjs <= (int)(uVar8 >> 1)) goto LAB_007e4303;
      pGVar10 = p->pObjs;
      Str_ManNormalize_rec(pNtk_00,p,pGVar10 + (uVar8 >> 1),vGroups,local_58);
      uVar15 = pGVar10[uVar8 >> 1].Value;
      if ((int)uVar15 < 0) goto LAB_007e4360;
      pVVar6 = p->vStore;
      if (pVVar6->nSize <= (int)pVVar13) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      pVVar6->pArray[(long)pVVar13] = uVar15 ^ uVar8 & 1;
      pVVar13 = (Vec_Int_t *)((long)&pVVar13->nCap + 1);
    } while ((int)pVVar13 < (int)local_50);
    if (pVVar6->nSize != (int)local_50) {
      __assert_fail("Vec_IntSize(p->vStore) == iEnd",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStr.c"
                    ,0x2d3,
                    "void Str_ManNormalize_rec(Str_Ntk_t *, Gia_Man_t *, Gia_Obj_t *, Vec_Wec_t *, Vec_Int_t *)"
                   );
    }
  }
  uVar8 = (uint)*(undefined8 *)local_40;
  if (((~uVar8 & 0x1fffffff) == 0 || (int)uVar8 < 0) ||
     (uVar15 = 4,
     ((uint)((ulong)*(undefined8 *)local_40 >> 0x20) & 0x1fffffff) <= (uVar8 & 0x1fffffff))) {
    uVar15 = 3;
  }
  if (((int)uVar5 < 0) || ((int)local_50 <= (int)uVar5)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
  }
  iVar16 = pNtk_00->nObjs;
  if (pNtk_00->nObjsAlloc <= iVar16) {
LAB_007e439e:
    __assert_fail("p->nObjs < p->nObjsAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStr.c"
                  ,0x70,"int Str_ObjCreate(Str_Ntk_t *, int, int, int *)");
  }
  piVar7 = pVVar6->pArray;
  pSVar4 = pNtk_00->pObjs;
  *(uint *)(pSVar4 + iVar16) = local_34 << 4 | uVar15;
  pSVar4[iVar16].iOffset = (pNtk_00->vFanins).nSize;
  pSVar4[iVar16].iTop = -1;
  pSVar4[iVar16].iCopy = -1;
  local_58 = pVVar14;
  if (0 < (int)local_34) {
    uVar17 = (ulong)local_34;
    uVar12 = 0;
    do {
      Vec_IntPush(&pNtk_00->vFanins,piVar7[(long)&pVVar14->nCap + uVar12]);
      if (piVar7[(long)&pVVar14->nCap + uVar12] < 0) {
LAB_007e42e4:
        __assert_fail("pFanins[i] >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStr.c"
                      ,0x78,"int Str_ObjCreate(Str_Ntk_t *, int, int, int *)");
      }
      uVar12 = uVar12 + 1;
    } while (uVar17 != uVar12);
  }
  pNtk_00->nObjCount[uVar15] = pNtk_00->nObjCount[uVar15] + 1;
  iVar16 = pNtk_00->nObjs;
  pNtk_00->nObjs = iVar16 + 1;
  if (-1 < iVar16) {
    local_40->Value = iVar16 * 2;
    if ((int)local_58 <= p->vStore->nSize) {
      p->vStore->nSize = (int)local_58;
      return;
    }
LAB_007e441a:
    __assertion = "p->nSize >= nSizeNew";
    __file = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
    ;
    __function = "void Vec_IntShrink(Vec_Int_t *, int)";
LAB_007e4446:
    __assert_fail(__assertion,__file,0x2b7,__function);
  }
LAB_007e43bd:
  __assert_fail("Var >= 0 && !(c >> 1)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                ,0x12e,"int Abc_Var2Lit(int, int)");
}

Assistant:

void Str_ManNormalize_rec( Str_Ntk_t * pNtk, Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Wec_t * vGroups, Vec_Int_t * vRoots )
{
    int i, k, iVar, iLit, iBeg, iEnd;
    if ( ~pObj->Value )
        return;
    pObj->Value = 0;
    assert( Gia_ObjIsAnd(pObj) );
    if ( Gia_ObjIsMux(p, pObj) )
    {
        Vec_Int_t * vGroup;
        Gia_Obj_t * pRoot, * pMux;
        int pFanins[3];
        if ( Vec_IntEntry(vRoots, Gia_ObjId(p, pObj)) == -1 )
        {
            Str_ManNormalize_rec( pNtk, p, Gia_ObjFanin0(pObj), vGroups, vRoots );
            Str_ManNormalize_rec( pNtk, p, Gia_ObjFanin1(pObj), vGroups, vRoots );
            Str_ManNormalize_rec( pNtk, p, Gia_ObjFanin2(p, pObj), vGroups, vRoots );
            pFanins[0] = Gia_ObjFanin0Copy(pObj);
            pFanins[1] = Gia_ObjFanin1Copy(pObj);
            pFanins[2] = Gia_ObjFanin2Copy(p, pObj);
            if ( Abc_LitIsCompl(pFanins[2]) )
            {
                pFanins[2] = Abc_LitNot(pFanins[2]);
                ABC_SWAP( int, pFanins[0], pFanins[1] );
            }
            pObj->Value = Str_ObjCreate( pNtk, STR_MUX, 3, pFanins );
            return;
        }
        vGroup = Vec_WecEntry( vGroups, Vec_IntEntry(vRoots, Gia_ObjId(p, pObj)) );
        // build data-inputs for each tree
        Gia_ManForEachObjVec( vGroup, p, pRoot, i )
        {
            Str_MuxInputsCollect( p, pRoot, p->vSuper );
            iBeg = Vec_IntSize( p->vStore );
            Vec_IntAppend( p->vStore, p->vSuper );
            iEnd = Vec_IntSize( p->vStore );
            Vec_IntForEachEntryStartStop( p->vStore, iVar, k, iBeg, iEnd )
                Str_ManNormalize_rec( pNtk, p, Gia_ManObj(p, iVar), vGroups, vRoots );
            Vec_IntShrink( p->vStore, iBeg );
        }
        // build internal structures
        Gia_ManForEachObjVec( vGroup, p, pRoot, i )
        {
            Str_MuxStructCollect( p, pRoot, p->vSuper );
            Gia_ManForEachObjVec( p->vSuper, p, pMux, k )
            {
                pFanins[0] = Gia_ObjFanin0Copy(pMux);
                pFanins[1] = Gia_ObjFanin1Copy(pMux);
                pFanins[2] = Gia_ObjFanin2Copy(p, pMux);
                if ( Abc_LitIsCompl(pFanins[2]) )
                {
                    pFanins[2] = Abc_LitNot(pFanins[2]);
                    ABC_SWAP( int, pFanins[0], pFanins[1] );
                }
                pMux->Value = Str_ObjCreate( pNtk, STR_MUX, 3, pFanins );
            }
            assert( ~pRoot->Value );
            // set mapping
            Gia_ManForEachObjVec( p->vSuper, p, pMux, k )
                Str_NtkObj(pNtk, Abc_Lit2Var(pMux->Value))->iTop = Abc_Lit2Var(pRoot->Value);
            pNtk->nTrees++;
        }
        assert( ~pObj->Value );
        // set mapping
        pObj = Gia_ManObj( p, Vec_IntEntryLast(vGroup) );
        Gia_ManForEachObjVec( vGroup, p, pRoot, i )
            Str_NtkObj(pNtk, Abc_Lit2Var(pRoot->Value))->iTop = Abc_Lit2Var(pObj->Value);
        pNtk->nGroups++;
        //printf( "%d x %d  ", Vec_IntSize(vGroup), Vec_IntSize(p->vSuper) );
        return;
    }
    // find supergate
    Gia_ManSuperCollect( p, pObj );
    // save entries
    iBeg = Vec_IntSize( p->vStore );
    Vec_IntAppend( p->vStore, p->vSuper );
    iEnd = Vec_IntSize( p->vStore );
    // call recursively
    Vec_IntForEachEntryStartStop( p->vStore, iLit, i, iBeg, iEnd )
    {
        Gia_Obj_t * pTemp = Gia_ManObj( p, Abc_Lit2Var(iLit) );
        Str_ManNormalize_rec( pNtk, p, pTemp, vGroups, vRoots );
        Vec_IntWriteEntry( p->vStore, i, Abc_LitNotCond(pTemp->Value, Abc_LitIsCompl(iLit)) );
    }
    assert( Vec_IntSize(p->vStore) == iEnd );
    // consider general case
    pObj->Value = Str_ObjCreate( pNtk, Gia_ObjIsXor(pObj) ? STR_XOR : STR_AND, iEnd-iBeg, Vec_IntEntryP(p->vStore, iBeg) );
    Vec_IntShrink( p->vStore, iBeg );
}